

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  cmTargetLinkLibraryType cVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  cmValue __lhs;
  bool bVar5;
  cmTargetLinkLibraryType cVar6;
  pointer __lhs_00;
  string_view arg;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  cmLinkItem item;
  string var;
  cmAlphaNum local_60;
  
  sVar4 = strlen(value);
  bVar3 = false;
  arg._M_str = value;
  arg._M_len = sVar4;
  cmExpandedList_abi_cxx11_(&deplist,arg,false);
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar6 = GENERAL_LibraryType;
  __lhs_00 = deplist.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs_00 ==
        deplist.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      AddLinkEntries<cmLinkItem>(this,depender_index,&actual_libs);
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&actual_libs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&deplist);
      return;
    }
    bVar2 = std::operator==(__lhs_00,"debug");
    bVar5 = true;
    if (bVar2) {
      cVar1 = DEBUG_LibraryType;
    }
    else {
      bVar2 = std::operator==(__lhs_00,"optimized");
      if (bVar2) {
        cVar1 = OPTIMIZED_LibraryType;
      }
      else {
        bVar2 = std::operator==(__lhs_00,"general");
        cVar1 = GENERAL_LibraryType;
        if ((!bVar2) &&
           (cVar1 = cVar6, bVar5 = bVar3, (pointer)__lhs_00->_M_string_length != (pointer)0x0)) {
          if (!bVar3) {
            item.String._M_string_length = (size_type)(__lhs_00->_M_dataplus)._M_p;
            local_60.View_._M_len = 10;
            local_60.View_._M_str = "_LINK_TYPE";
            item.String._M_dataplus._M_p = (pointer)__lhs_00->_M_string_length;
            cmStrCat<>(&var,(cmAlphaNum *)&item,&local_60);
            __lhs = cmMakefile::GetDefinition(this->Makefile,&var);
            if (__lhs.Value != (string *)0x0) {
              bVar3 = std::operator==(__lhs.Value,"debug");
              cVar1 = DEBUG_LibraryType;
              if ((!bVar3) &&
                 (bVar3 = std::operator==(__lhs.Value,"optimized"), cVar1 = cVar6, bVar3)) {
                cVar1 = OPTIMIZED_LibraryType;
              }
            }
            cVar6 = cVar1;
            std::__cxx11::string::~string((string *)&var);
          }
          if ((cVar6 == GENERAL_LibraryType) || (cVar6 == this->LinkType)) {
            ResolveLinkItem(&item,this,depender_index,__lhs_00);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      (&actual_libs,&item);
          }
          else {
            cVar1 = GENERAL_LibraryType;
            bVar5 = false;
            if (this->OldLinkDirMode != true) goto LAB_0045518f;
            ResolveLinkItem(&item,this,depender_index,__lhs_00);
            CheckWrongConfigItem(this,&item);
          }
          cmLinkItem::~cmLinkItem(&item);
          cVar1 = GENERAL_LibraryType;
          bVar5 = false;
        }
      }
    }
LAB_0045518f:
    bVar3 = bVar5;
    cVar6 = cVar1;
    __lhs_00 = __lhs_00 + 1;
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist = cmExpandedList(value);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::string const& d : deplist) {
    if (d == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (d == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (d == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!d.empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = cmStrCat(d, "_LINK_TYPE");
        if (cmValue val = this->Makefile->GetDefinition(var)) {
          if (*val == "debug") {
            llt = DEBUG_LibraryType;
          } else if (*val == "optimized") {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        actual_libs.emplace_back(this->ResolveLinkItem(depender_index, d));
      } else if (this->OldLinkDirMode) {
        cmLinkItem item = this->ResolveLinkItem(depender_index, d);
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}